

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_extension.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::ExtensionGenerator::GenerateDeclaration
          (ExtensionGenerator *this,Printer *printer)

{
  bool bVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_70 [8];
  string qualifier;
  Formatter format;
  Printer *printer_local;
  ExtensionGenerator *this_local;
  
  Formatter::Formatter((Formatter *)((long)&qualifier.field_2 + 8),printer,&this->variables_);
  std::__cxx11::string::string((string *)local_70);
  bVar1 = IsScoped(this);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)local_70,"static");
  }
  else {
    std::__cxx11::string::operator=((string *)local_70,"extern");
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::operator+(&local_c0,&(this->options_).dllexport_decl," ");
      std::operator+(&local_a0,&local_c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
      std::__cxx11::string::operator=((string *)local_70,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_c0);
    }
  }
  Formatter::operator()
            ((Formatter *)((long)&qualifier.field_2 + 8),
             "static const int $constant_name$ = $number$;\n$1$ ::$proto_ns$::internal::ExtensionIdentifier< $extendee$,\n    ::$proto_ns$::internal::$type_traits$, $field_type$, $packed$ >\n  ${2$$name$$}$;\n"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
             &this->descriptor_);
  std::__cxx11::string::~string((string *)local_70);
  Formatter::~Formatter((Formatter *)((long)&qualifier.field_2 + 8));
  return;
}

Assistant:

void ExtensionGenerator::GenerateDeclaration(io::Printer* printer) const {
  Formatter format(printer, variables_);

  // If this is a class member, it needs to be declared "static".  Otherwise,
  // it needs to be "extern".  In the latter case, it also needs the DLL
  // export/import specifier.
  std::string qualifier;
  if (!IsScoped()) {
    qualifier = "extern";
    if (!options_.dllexport_decl.empty()) {
      qualifier = options_.dllexport_decl + " " + qualifier;
    }
  } else {
    qualifier = "static";
  }

  format(
      "static const int $constant_name$ = $number$;\n"
      "$1$ ::$proto_ns$::internal::ExtensionIdentifier< $extendee$,\n"
      "    ::$proto_ns$::internal::$type_traits$, $field_type$, $packed$ >\n"
      "  ${2$$name$$}$;\n",
      qualifier, descriptor_);
}